

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O3

RPCHelpMan * getmininginfo(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string name;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  char cVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long *plVar7;
  RPCHelpMan *in_RDI;
  undefined8 uVar8;
  long lVar9;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined4 in_stack_fffffffffffff488;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff48c;
  undefined8 in_stack_fffffffffffff490;
  undefined7 in_stack_fffffffffffff4a0;
  undefined1 in_stack_fffffffffffff4a7;
  undefined8 in_stack_fffffffffffff4a8;
  undefined8 in_stack_fffffffffffff4b0;
  undefined8 in_stack_fffffffffffff4b8;
  code *pcVar11;
  undefined8 in_stack_fffffffffffff4c0;
  undefined1 in_stack_fffffffffffff4c8 [16];
  pointer in_stack_fffffffffffff4d8;
  pointer in_stack_fffffffffffff4e0;
  pointer in_stack_fffffffffffff4e8;
  pointer in_stack_fffffffffffff4f0;
  undefined1 in_stack_fffffffffffff4f8 [16];
  pointer in_stack_fffffffffffff508;
  pointer in_stack_fffffffffffff510;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ad8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ab8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a98;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a78;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a58;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a38;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a18;
  vector<RPCResult,_std::allocator<RPCResult>_> local_9f8;
  RPCResults local_9e0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  ulong *local_8e8;
  undefined8 local_8e0;
  ulong local_8d8;
  undefined8 uStack_8d0;
  ulong *local_8c8;
  size_type local_8c0;
  ulong local_8b8;
  undefined8 uStack_8b0;
  long *local_8a8 [2];
  long local_898 [2];
  long *local_888 [2];
  long local_878 [2];
  RPCResult local_868;
  long *local_7e0 [2];
  long local_7d0 [2];
  long *local_7c0 [2];
  long local_7b0 [2];
  long *local_7a0 [2];
  long local_790 [2];
  long *local_780 [2];
  long local_770 [2];
  string local_760;
  long *local_740 [2];
  long local_730 [2];
  long *local_720 [2];
  long local_710 [2];
  long *local_700 [2];
  long local_6f0 [2];
  long *local_6e0 [2];
  long local_6d0 [2];
  long *local_6c0 [2];
  long local_6b0 [2];
  long *local_6a0 [2];
  long local_690 [2];
  long *local_680 [2];
  long local_670 [2];
  long *local_660 [2];
  long local_650 [2];
  long *local_640 [2];
  long local_630 [2];
  long *local_620 [2];
  long local_610 [2];
  long *local_600 [2];
  long local_5f0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_5e0;
  long *local_5c0 [2];
  long local_5b0 [2];
  pointer local_5a0 [2];
  undefined1 local_590 [152];
  RPCResult local_4f8;
  RPCResult local_470;
  RPCResult local_3e8;
  RPCResult local_360;
  RPCResult local_2d8;
  RPCResult local_250;
  RPCResult local_1c8;
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getmininginfo","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"\nReturns a json object containing mining-related information.","")
  ;
  local_120[0] = local_110;
  local_9c8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_9c8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_9c8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"");
  local_5a0[0] = (pointer)local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"blocks","");
  local_5c0[0] = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c0,"The current block","");
  local_a18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff48c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff488;
  m_key_name._M_string_length = in_stack_fffffffffffff490;
  m_key_name.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name.field_2._8_7_ = in_stack_fffffffffffff4a0;
  m_key_name.field_2._M_local_buf[0xf] = in_stack_fffffffffffff4a7;
  description._M_string_length = in_stack_fffffffffffff4b0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4a8;
  description.field_2._M_allocated_capacity = in_stack_fffffffffffff4b8;
  description.field_2._8_8_ = in_stack_fffffffffffff4c0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffff4d8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_fffffffffffff4c8._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffff4c8._8_8_;
  RPCResult::RPCResult
            ((RPCResult *)(local_590 + 0x10),NUM,m_key_name,description,inner,SUB81(local_5a0,0));
  local_5e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_5e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"currentblockweight","");
  local_600[0] = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_600,
             "The block weight of the last assembled block (only present if a block was ever assembled)"
             ,"");
  local_a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._4_8_ = in_stack_fffffffffffff490;
  auVar3._0_4_ = in_stack_fffffffffffff48c;
  auVar3._12_8_ = in_RDI;
  auVar3._20_7_ = in_stack_fffffffffffff4a0;
  auVar3[0x1b] = in_stack_fffffffffffff4a7;
  auVar3._28_4_ = 0;
  description_00._M_string_length = in_stack_fffffffffffff4b0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4a8;
  description_00.field_2._M_allocated_capacity = in_stack_fffffffffffff4b8;
  description_00.field_2._8_8_ = in_stack_fffffffffffff4c0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4d8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffff4c8._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffff4c8._8_8_;
  RPCResult::RPCResult
            (&local_4f8,NUM,(string)(auVar3 << 0x20),SUB81(&local_5e0,0),description_00,inner_00,
             true);
  local_620[0] = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"currentblocktx","");
  local_640[0] = local_630;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_640,
             "The number of block transactions of the last assembled block (only present if a block was ever assembled)"
             ,"");
  local_a58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = 0;
  auVar4._4_8_ = in_stack_fffffffffffff490;
  auVar4._0_4_ = in_stack_fffffffffffff48c;
  auVar4._12_8_ = in_RDI;
  auVar4._20_7_ = in_stack_fffffffffffff4a0;
  auVar4[0x1b] = in_stack_fffffffffffff4a7;
  auVar4._28_4_ = 0;
  description_01._M_string_length = in_stack_fffffffffffff4b0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4a8;
  description_01.field_2._M_allocated_capacity = in_stack_fffffffffffff4b8;
  description_01.field_2._8_8_ = in_stack_fffffffffffff4c0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4d8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffff4c8._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffff4c8._8_8_;
  RPCResult::RPCResult
            (&local_470,NUM,(string)(auVar4 << 0x20),SUB81(local_620,0),description_01,inner_01,true
            );
  local_660[0] = local_650;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"difficulty","");
  local_680[0] = local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"The current difficulty","");
  local_a78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a78.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff48c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_00._M_string_length = in_stack_fffffffffffff490;
  m_key_name_00.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_00.field_2._8_7_ = in_stack_fffffffffffff4a0;
  m_key_name_00.field_2._M_local_buf[0xf] = in_stack_fffffffffffff4a7;
  description_02._M_string_length = in_stack_fffffffffffff4b0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4a8;
  description_02.field_2._M_allocated_capacity = in_stack_fffffffffffff4b8;
  description_02.field_2._8_8_ = in_stack_fffffffffffff4c0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4d8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffff4c8._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffff4c8._8_8_;
  RPCResult::RPCResult(&local_3e8,NUM,m_key_name_00,description_02,inner_02,SUB81(local_660,0));
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"networkhashps","");
  local_6c0[0] = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6c0,"The network hashes per second","");
  local_a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a98.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff48c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_01._M_string_length = in_stack_fffffffffffff490;
  m_key_name_01.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_01.field_2._8_7_ = in_stack_fffffffffffff4a0;
  m_key_name_01.field_2._M_local_buf[0xf] = in_stack_fffffffffffff4a7;
  description_03._M_string_length = in_stack_fffffffffffff4b0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4a8;
  description_03.field_2._M_allocated_capacity = in_stack_fffffffffffff4b8;
  description_03.field_2._8_8_ = in_stack_fffffffffffff4c0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4d8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffff4c8._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffff4c8._8_8_;
  RPCResult::RPCResult(&local_360,NUM,m_key_name_01,description_03,inner_03,SUB81(local_6a0,0));
  local_6e0[0] = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"pooledtx","");
  local_700[0] = local_6f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"The size of the mempool","");
  local_ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff48c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_02._M_string_length = in_stack_fffffffffffff490;
  m_key_name_02.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_02.field_2._8_7_ = in_stack_fffffffffffff4a0;
  m_key_name_02.field_2._M_local_buf[0xf] = in_stack_fffffffffffff4a7;
  description_04._M_string_length = in_stack_fffffffffffff4b0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4a8;
  description_04.field_2._M_allocated_capacity = in_stack_fffffffffffff4b8;
  description_04.field_2._8_8_ = in_stack_fffffffffffff4c0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4d8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffff4c8._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffff4c8._8_8_;
  RPCResult::RPCResult(&local_2d8,NUM,m_key_name_02,description_04,inner_04,SUB81(local_6e0,0));
  local_720[0] = local_710;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"chain","");
  local_740[0] = local_730;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_740,"current network name (main, test, testnet4, signet, regtest)","");
  local_ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff48c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_03._M_string_length = in_stack_fffffffffffff490;
  m_key_name_03.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_03.field_2._8_7_ = in_stack_fffffffffffff4a0;
  m_key_name_03.field_2._M_local_buf[0xf] = in_stack_fffffffffffff4a7;
  description_05._M_string_length = in_stack_fffffffffffff4b0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4a8;
  description_05.field_2._M_allocated_capacity = in_stack_fffffffffffff4b8;
  description_05.field_2._8_8_ = in_stack_fffffffffffff4c0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4d8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffff4c8._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffff4c8._8_8_;
  RPCResult::RPCResult(&local_250,STR,m_key_name_03,description_05,inner_05,SUB81(local_720,0));
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"warnings","");
  cVar5 = IsDeprecatedRPCEnabled(&local_760);
  if ((bool)cVar5) {
    local_780[0] = local_770;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_780,"warnings","");
    local_7a0[0] = local_790;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7a0,"any network and blockchain warnings (DEPRECATED)","");
    in_stack_fffffffffffff508 = (pointer)0x0;
    in_stack_fffffffffffff510 = (pointer)0x0;
    m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff48c;
    m_key_name_04._M_dataplus._M_p._0_4_ = uVar10;
    m_key_name_04._M_string_length = in_stack_fffffffffffff490;
    m_key_name_04.field_2._M_allocated_capacity = (size_type)in_RDI;
    m_key_name_04.field_2._8_7_ = in_stack_fffffffffffff4a0;
    m_key_name_04.field_2._M_local_buf[0xf] = in_stack_fffffffffffff4a7;
    description_06._M_string_length = in_stack_fffffffffffff4b0;
    description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4a8;
    description_06.field_2._M_allocated_capacity = in_stack_fffffffffffff4b8;
    description_06.field_2._8_8_ = in_stack_fffffffffffff4c0;
    inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff4d8;
    inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4c8._0_8_;
    inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff4c8._8_8_;
    RPCResult::RPCResult(&local_1c8,STR,m_key_name_04,description_06,inner_06,SUB81(local_780,0));
  }
  else {
    local_7c0[0] = local_7b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7c0,"warnings","");
    local_7e0[0] = local_7d0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7e0,
               "any network and blockchain warnings (run with `-deprecatedrpc=warnings` to return the latest warning as a single string)"
               ,"");
    local_888[0] = local_878;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_888,"");
    local_8a8[0] = local_898;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_8a8,"warning","");
    in_stack_fffffffffffff4d8 = (pointer)0x0;
    in_stack_fffffffffffff4e0 = (pointer)0x0;
    in_stack_fffffffffffff4e8 = (pointer)0x0;
    m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff48c;
    m_key_name_05._M_dataplus._M_p._0_4_ = uVar10;
    m_key_name_05._M_string_length = in_stack_fffffffffffff490;
    m_key_name_05.field_2._M_allocated_capacity = (size_type)in_RDI;
    m_key_name_05.field_2._8_7_ = in_stack_fffffffffffff4a0;
    m_key_name_05.field_2._M_local_buf[0xf] = in_stack_fffffffffffff4a7;
    description_07._M_string_length = in_stack_fffffffffffff4b0;
    description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4a8;
    description_07.field_2._M_allocated_capacity = in_stack_fffffffffffff4b8;
    description_07.field_2._8_8_ = in_stack_fffffffffffff4c0;
    inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4c8._0_8_;
    inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff4c8._8_8_;
    RPCResult::RPCResult(&local_868,STR,m_key_name_05,description_07,inner_07,SUB81(local_888,0));
    __l._M_len = 1;
    __l._M_array = &local_868;
    std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4f0,__l,
               (allocator_type *)&stack0xfffffffffffff4d7);
    m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff48c;
    m_key_name_06._M_dataplus._M_p._0_4_ = uVar10;
    m_key_name_06._M_string_length = in_stack_fffffffffffff490;
    m_key_name_06.field_2._M_allocated_capacity = (size_type)in_RDI;
    m_key_name_06.field_2._8_7_ = in_stack_fffffffffffff4a0;
    m_key_name_06.field_2._M_local_buf[0xf] = in_stack_fffffffffffff4a7;
    description_08._M_string_length = in_stack_fffffffffffff4b0;
    description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4a8;
    description_08.field_2._M_allocated_capacity = in_stack_fffffffffffff4b8;
    description_08.field_2._8_8_ = in_stack_fffffffffffff4c0;
    inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff4d8;
    inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4c8._0_8_;
    inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff4c8._8_8_;
    RPCResult::RPCResult(&local_1c8,ARR,m_key_name_06,description_08,inner_08,SUB81(local_7c0,0));
  }
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)(local_590 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_9f8,__l_00,(allocator_type *)&stack0xfffffffffffff4d6);
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff48c;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar10;
  m_key_name_07._M_string_length = in_stack_fffffffffffff490;
  m_key_name_07.field_2._M_allocated_capacity = (size_type)in_RDI;
  m_key_name_07.field_2._8_7_ = in_stack_fffffffffffff4a0;
  m_key_name_07.field_2._M_local_buf[0xf] = cVar5;
  description_09._M_string_length = in_stack_fffffffffffff4b0;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4a8;
  description_09.field_2._M_allocated_capacity = in_stack_fffffffffffff4b8;
  description_09.field_2._8_8_ = in_stack_fffffffffffff4c0;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffff4d8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffff4c8._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffff4c8._8_8_;
  RPCResult::RPCResult(&local_100,OBJ,m_key_name_07,description_09,inner_09,SUB81(local_120,0));
  result._4_4_ = in_stack_fffffffffffff48c;
  result.m_type = uVar10;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff490;
  result.m_key_name._M_string_length = (size_type)in_RDI;
  result.m_key_name.field_2._M_allocated_capacity._0_7_ = in_stack_fffffffffffff4a0;
  result.m_key_name.field_2._M_local_buf[7] = cVar5;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff4a8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff4b0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff4b8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff4c0;
  result.m_optional = (bool)in_stack_fffffffffffff4c8[0];
  result.m_skip_type_check = (bool)in_stack_fffffffffffff4c8[1];
  result._66_6_ = in_stack_fffffffffffff4c8._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4c8._8_8_;
  result.m_description._M_string_length = (size_type)in_stack_fffffffffffff4d8;
  result.m_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff4e0;
  result.m_description.field_2._8_8_ = in_stack_fffffffffffff4e8;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4f0;
  result.m_cond._8_16_ = in_stack_fffffffffffff4f8;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff508;
  RPCResults::RPCResults(&local_9e0,result);
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_928,"getmininginfo","");
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_948,"");
  HelpExampleCli(&local_908,&local_928,&local_948);
  local_988._M_dataplus._M_p = (pointer)&local_988.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"getmininginfo","");
  local_9a8._M_dataplus._M_p = (pointer)&local_9a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a8,"");
  HelpExampleRpc(&local_968,&local_988,&local_9a8);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    uVar8 = local_908.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_968._M_string_length + local_908._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_968._M_dataplus._M_p != &local_968.field_2) {
      uVar8 = local_968.field_2._M_allocated_capacity;
    }
    if (local_968._M_string_length + local_908._M_string_length <= (ulong)uVar8) {
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_968,0,0,local_908._M_dataplus._M_p,local_908._M_string_length);
      goto LAB_00a166d0;
    }
  }
  pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_908,local_968._M_dataplus._M_p,local_968._M_string_length);
LAB_00a166d0:
  local_8e8 = &local_8d8;
  puVar2 = (ulong *)(pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_8d8 = paVar1->_M_allocated_capacity;
    uStack_8d0 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_8d8 = paVar1->_M_allocated_capacity;
    local_8e8 = puVar2;
  }
  local_8c0 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_8e8 == &local_8d8) {
    uStack_8b0 = uStack_8d0;
    local_8c8 = &local_8b8;
  }
  else {
    local_8c8 = local_8e8;
  }
  local_8b8 = local_8d8;
  local_8e0 = 0;
  local_8d8 = local_8d8 & 0xffffffffffffff00;
  pcVar11 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mining.cpp:441:9)>
            ::_M_manager;
  name._M_string_length = in_stack_fffffffffffff490;
  name._M_dataplus._M_p = &stack0xfffffffffffff4a8;
  name.field_2._M_allocated_capacity = (size_type)in_RDI;
  name.field_2._8_7_ = in_stack_fffffffffffff4a0;
  name.field_2._M_local_buf[0xf] = cVar5;
  description_10.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mining.cpp:441:9)>
       ::_M_manager;
  description_10._M_dataplus._M_p = (pointer)0x0;
  description_10._M_string_length = 0;
  description_10.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mining.cpp:441:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff4d8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_fffffffffffff4c8._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffff4c8._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = in_stack_fffffffffffff4e8;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = in_stack_fffffffffffff4e0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff4f0;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff508;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff4f8._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff4f8._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff510;
  local_8e8 = &local_8d8;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name,description_10,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar11 != (code *)0x0) {
    (*pcVar11)(&stack0xfffffffffffff4a8,&stack0xfffffffffffff4a8,3);
  }
  if (local_8c8 != &local_8b8) {
    operator_delete(local_8c8,local_8b8 + 1);
  }
  if (local_8e8 != &local_8d8) {
    operator_delete(local_8e8,local_8d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a8._M_dataplus._M_p != &local_9a8.field_2) {
    operator_delete(local_9a8._M_dataplus._M_p,local_9a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988._M_dataplus._M_p != &local_988.field_2) {
    operator_delete(local_988._M_dataplus._M_p,local_988.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,local_948.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_9e0.m_results);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_9f8);
  lVar9 = 0x440;
  do {
    if ((long *)(local_590 + lVar9) != *(long **)((long)local_5a0 + lVar9)) {
      operator_delete(*(long **)((long)local_5a0 + lVar9),*(long *)(local_590 + lVar9) + 1);
    }
    if ((long *)((long)local_5b0 + lVar9) != *(long **)((long)local_5c0 + lVar9)) {
      operator_delete(*(long **)((long)local_5c0 + lVar9),*(long *)((long)local_5b0 + lVar9) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_5e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar9));
    if ((long *)((long)local_5f0 + lVar9) != *(long **)((long)local_600 + lVar9)) {
      operator_delete(*(long **)((long)local_600 + lVar9),*(long *)((long)local_5f0 + lVar9) + 1);
    }
    lVar9 = lVar9 + -0x88;
  } while (lVar9 != 0);
  if (cVar5 == '\0') {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_868.m_cond._M_dataplus._M_p != &local_868.m_cond.field_2) {
      operator_delete(local_868.m_cond._M_dataplus._M_p,
                      local_868.m_cond.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_868.m_description._M_dataplus._M_p != &local_868.m_description.field_2) {
      operator_delete(local_868.m_description._M_dataplus._M_p,
                      local_868.m_description.field_2._M_allocated_capacity + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_868.m_inner);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_868.m_key_name._M_dataplus._M_p != &local_868.m_key_name.field_2) {
      operator_delete(local_868.m_key_name._M_dataplus._M_p,
                      local_868.m_key_name.field_2._M_allocated_capacity + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff4d8);
    if (local_8a8[0] != local_898) {
      operator_delete(local_8a8[0],local_898[0] + 1);
    }
    if (local_888[0] != local_878) {
      operator_delete(local_888[0],local_878[0] + 1);
    }
    if (local_7e0[0] != local_7d0) {
      operator_delete(local_7e0[0],local_7d0[0] + 1);
    }
    plVar7 = local_7b0;
  }
  else {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff508);
    if (local_7a0[0] != local_790) {
      operator_delete(local_7a0[0],local_790[0] + 1);
    }
    plVar7 = local_770;
  }
  if ((long *)plVar7[-2] != plVar7) {
    operator_delete((long *)plVar7[-2],*plVar7 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ad8);
  if (local_740[0] != local_730) {
    operator_delete(local_740[0],local_730[0] + 1);
  }
  if (local_720[0] != local_710) {
    operator_delete(local_720[0],local_710[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ab8);
  if (local_700[0] != local_6f0) {
    operator_delete(local_700[0],local_6f0[0] + 1);
  }
  if (local_6e0[0] != local_6d0) {
    operator_delete(local_6e0[0],local_6d0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a98);
  if (local_6c0[0] != local_6b0) {
    operator_delete(local_6c0[0],local_6b0[0] + 1);
  }
  if (local_6a0[0] != local_690) {
    operator_delete(local_6a0[0],local_690[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a78);
  if (local_680[0] != local_670) {
    operator_delete(local_680[0],local_670[0] + 1);
  }
  if (local_660[0] != local_650) {
    operator_delete(local_660[0],local_650[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a58);
  if (local_640[0] != local_630) {
    operator_delete(local_640[0],local_630[0] + 1);
  }
  if (local_620[0] != local_610) {
    operator_delete(local_620[0],local_610[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a38);
  if (local_600[0] != local_5f0) {
    operator_delete(local_600[0],local_5f0[0] + 1);
  }
  if (local_5e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_5e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_5e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_5e0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a18);
  if (local_5c0[0] != local_5b0) {
    operator_delete(local_5c0[0],local_5b0[0] + 1);
  }
  if (local_5a0[0] != (pointer)local_590) {
    operator_delete(local_5a0[0],local_590._0_8_ + 1);
  }
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_9c8);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getmininginfo()
{
    return RPCHelpMan{"getmininginfo",
                "\nReturns a json object containing mining-related information.",
                {},
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::NUM, "blocks", "The current block"},
                        {RPCResult::Type::NUM, "currentblockweight", /*optional=*/true, "The block weight of the last assembled block (only present if a block was ever assembled)"},
                        {RPCResult::Type::NUM, "currentblocktx", /*optional=*/true, "The number of block transactions of the last assembled block (only present if a block was ever assembled)"},
                        {RPCResult::Type::NUM, "difficulty", "The current difficulty"},
                        {RPCResult::Type::NUM, "networkhashps", "The network hashes per second"},
                        {RPCResult::Type::NUM, "pooledtx", "The size of the mempool"},
                        {RPCResult::Type::STR, "chain", "current network name (" LIST_CHAIN_NAMES ")"},
                        (IsDeprecatedRPCEnabled("warnings") ?
                            RPCResult{RPCResult::Type::STR, "warnings", "any network and blockchain warnings (DEPRECATED)"} :
                            RPCResult{RPCResult::Type::ARR, "warnings", "any network and blockchain warnings (run with `-deprecatedrpc=warnings` to return the latest warning as a single string)",
                            {
                                {RPCResult::Type::STR, "", "warning"},
                            }
                            }
                        ),
                    }},
                RPCExamples{
                    HelpExampleCli("getmininginfo", "")
            + HelpExampleRpc("getmininginfo", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CTxMemPool& mempool = EnsureMemPool(node);
    ChainstateManager& chainman = EnsureChainman(node);
    LOCK(cs_main);
    const CChain& active_chain = chainman.ActiveChain();

    UniValue obj(UniValue::VOBJ);
    obj.pushKV("blocks",           active_chain.Height());
    if (BlockAssembler::m_last_block_weight) obj.pushKV("currentblockweight", *BlockAssembler::m_last_block_weight);
    if (BlockAssembler::m_last_block_num_txs) obj.pushKV("currentblocktx", *BlockAssembler::m_last_block_num_txs);
    obj.pushKV("difficulty", GetDifficulty(*CHECK_NONFATAL(active_chain.Tip())));
    obj.pushKV("networkhashps",    getnetworkhashps().HandleRequest(request));
    obj.pushKV("pooledtx",         (uint64_t)mempool.size());
    obj.pushKV("chain", chainman.GetParams().GetChainTypeString());
    obj.pushKV("warnings", node::GetWarningsForRpc(*CHECK_NONFATAL(node.warnings), IsDeprecatedRPCEnabled("warnings")));
    return obj;
},
    };
}